

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexCompileTime.cpp
# Opt level: O3

void __thiscall
UnifiedRegex::MatchLiteralNode::Print(MatchLiteralNode *this,DebugWriter *w,Char *litbuf)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  
  DebugWriter::Print(w,L"MatchLiteral(");
  bVar1 = this->isEquivClass;
  uVar2 = 0;
  do {
    if (uVar2 != 0) {
      DebugWriter::Print(w,L", ");
    }
    DebugWriter::Print(w,L"\"");
    if (this->length != 0) {
      uVar3 = 0;
      do {
        DebugWriter::PrintEscapedChar
                  (w,litbuf[(uVar3 << (bVar1 * '\x02' & 0x1fU)) + uVar2 + this->offset]);
        uVar3 = uVar3 + 1;
      } while (uVar3 < this->length);
    }
    DebugWriter::Print(w,L"\"");
  } while ((uVar2 < 3) && (uVar2 = uVar2 + 1, bVar1 != false));
  DebugWriter::PrintEOL(w,L")");
  Node::PrintAnnotations(&this->super_Node,w);
  return;
}

Assistant:

void MatchLiteralNode::Print(DebugWriter* w, const Char* litbuf) const
    {
        w->Print(_u("MatchLiteral("));
        int skip = isEquivClass ? CaseInsensitive::EquivClassSize : 1;
        for (int i = 0; i < skip; i++)
        {
            if (i > 0)
                w->Print(_u(", "));
            w->Print(_u("\""));
            for (CharCount j = 0; j < length; j++)
                w->PrintEscapedChar(litbuf[offset + j * skip + i]);
            w->Print(_u("\""));
        }
        w->PrintEOL(_u(")"));
        PrintAnnotations(w);
    }